

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

ON__UINT64 __thiscall
ON_3DM_BIG_CHUNK::LengthRemaining(ON_3DM_BIG_CHUNK *this,ON__UINT64 current_position)

{
  ON__UINT64 OVar1;
  ON__UINT64 OVar2;
  
  OVar2 = 0;
  OVar1 = this->m_end_offset - current_position;
  if (this->m_end_offset < current_position) {
    OVar1 = OVar2;
  }
  if (current_position < this->m_start_offset) {
    OVar1 = OVar2;
  }
  if ((int)this->m_typecode < 0) {
    OVar1 = OVar2;
  }
  return OVar1;
}

Assistant:

ON__UINT64 ON_3DM_BIG_CHUNK::LengthRemaining(
  ON__UINT64 current_position
) const
{
  if (0 == (TCODE_SHORT & m_typecode)
    && m_start_offset <= current_position
    && current_position <= m_end_offset)
  {
    return (m_end_offset - current_position);
  }

  return 0;
}